

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

ConstTokenOrSyntax * __thiscall
slang::syntax::BinSelectWithFilterExprSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,BinSelectWithFilterExprSyntax *this,
          size_t index)

{
  __index_type _Var1;
  MatchesClauseSyntax *pMVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  switch(index) {
  case 0:
    pMVar2 = (MatchesClauseSyntax *)(this->expr).ptr;
    break;
  case 1:
    uVar3._0_2_ = (this->with).kind;
    uVar3._2_1_ = (this->with).field_0x2;
    uVar3._3_1_ = (this->with).numFlags;
    uVar4 = (this->with).rawLen;
    uVar5 = *(undefined4 *)&(this->with).info;
    uVar6 = *(undefined4 *)((long)&(this->with).info + 4);
    goto LAB_0058fd0a;
  case 2:
    uVar3._0_2_ = (this->openParen).kind;
    uVar3._2_1_ = (this->openParen).field_0x2;
    uVar3._3_1_ = (this->openParen).numFlags;
    uVar4 = (this->openParen).rawLen;
    uVar5 = *(undefined4 *)&(this->openParen).info;
    uVar6 = *(undefined4 *)((long)&(this->openParen).info + 4);
    goto LAB_0058fd0a;
  case 3:
    pMVar2 = (MatchesClauseSyntax *)(this->filter).ptr;
    break;
  case 4:
    uVar3._0_2_ = (this->closeParen).kind;
    uVar3._2_1_ = (this->closeParen).field_0x2;
    uVar3._3_1_ = (this->closeParen).numFlags;
    uVar4 = (this->closeParen).rawLen;
    uVar5 = *(undefined4 *)&(this->closeParen).info;
    uVar6 = *(undefined4 *)((long)&(this->closeParen).info + 4);
LAB_0058fd0a:
    *(undefined4 *)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar3
    ;
    *(uint32_t *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 4) = uVar4;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 8) = uVar5;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 0xc) = uVar6;
LAB_0058fd22:
    _Var1 = '\0';
    goto LAB_0058fd24;
  case 5:
    pMVar2 = this->matchesClause;
    break;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_0058fd22;
  }
  *(MatchesClauseSyntax **)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pMVar2;
  _Var1 = '\x01';
LAB_0058fd24:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var1;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax BinSelectWithFilterExprSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return expr.get();
        case 1: return with;
        case 2: return openParen;
        case 3: return filter.get();
        case 4: return closeParen;
        case 5: return matchesClause;
        default: return nullptr;
    }
}